

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXMLWrapper.h
# Opt level: O3

void __thiscall
Assimp::CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
          (CIrrXML_IOStreamReader *this,IOStream *_stream)

{
  pointer pcVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __dest;
  char *pcVar3;
  char *__src;
  undefined8 uStack_28;
  
  (this->super_IFileReadCallBack)._vptr_IFileReadCallBack =
       (_func_int **)&PTR__CIrrXML_IOStreamReader_007de5b8;
  this->stream = _stream;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->t = 0;
  uStack_28 = in_RAX;
  iVar2 = (*_stream->_vptr_IOStream[6])(_stream);
  std::vector<char,_std::allocator<char>_>::resize(&this->data,CONCAT44(extraout_var,iVar2));
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*this->stream->_vptr_IOStream[2])
            (this->stream,pcVar1,
             (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar1,1);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     ((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  pcVar3 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest._M_current != pcVar3) {
    do {
      __src = __dest._M_current + 1;
      if (__src != pcVar3) {
        memmove(__dest._M_current,__src,(long)pcVar3 - (long)__src);
        pcVar3 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar3 + -1;
      uStack_28._0_7_ = (uint7)(uint6)uStack_28;
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (__dest._M_current,pcVar3 + -1,(long)&uStack_28 + 6);
      pcVar3 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (__dest._M_current != pcVar3);
  }
  BaseImporter::ConvertToUTF8(&this->data);
  return;
}

Assistant:

explicit CIrrXML_IOStreamReader(IOStream* _stream)
        : stream (_stream)
        , t (0)
    {

        // Map the buffer into memory and convert it to UTF8. IrrXML provides its
        // own conversion, which is merely a cast from uintNN_t to uint8_t. Thus,
        // it is not suitable for our purposes and we have to do it BEFORE IrrXML
        // gets the buffer. Sadly, this forces us to map the whole file into
        // memory.

        data.resize(stream->FileSize());
        stream->Read(&data[0],data.size(),1);

        // Remove null characters from the input sequence otherwise the parsing will utterly fail
        // std::find is usually much faster than manually iterating
        // It is very unlikely that there will be any null characters
        auto null_char_iter = std::find(data.begin(), data.end(), '\0');

        while (null_char_iter != data.end())
        {
            null_char_iter = data.erase(null_char_iter);
            null_char_iter = std::find(null_char_iter, data.end(), '\0');
        }

        BaseImporter::ConvertToUTF8(data);
    }